

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

void enumerate_ints(MAFSA_automaton ma,MAFSA_stack_struct *ptr_stack,uint32_t cstate,
                   MAFSA_automaton_string_handler fetcher,void *user_data)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  if ((int)cstate < 0) {
    (*fetcher)(user_data,ptr_stack->buffer,ptr_stack->current + 1);
  }
  uVar4 = cstate & 0x7fffffff;
  uVar3 = ma->ptr_links[uVar4];
  if (uVar3 != 0xff000000) {
    lVar2 = ptr_stack->current;
    do {
      uVar4 = uVar4 + 1;
      uVar1 = lVar2 + 1;
      if (uVar1 < ptr_stack->reserved) {
        ptr_stack->current = uVar1;
        ptr_stack->buffer[uVar1] = (MAFSA_letter)(uVar3 >> 0x18);
      }
      enumerate_ints(ma,ptr_stack,ma->ptr_nodes[uVar3 & 0xffffff],fetcher,user_data);
      lVar2 = ptr_stack->current;
      if (-1 < lVar2) {
        lVar2 = lVar2 + -1;
        ptr_stack->current = lVar2;
      }
      uVar3 = ma->ptr_links[uVar4];
    } while (uVar3 != 0xff000000);
  }
  return;
}

Assistant:

static void enumerate_ints(const MAFSA_automaton ma, struct MAFSA_stack_struct *ptr_stack,
    uint32_t cstate, MAFSA_automaton_string_handler fetcher, void *user_data)
{
    uint32_t links_begin, child, where;

    if (node_is_final(cstate))
    {
        fetcher(user_data, ptr_stack->buffer, stack_size(ptr_stack));
    }

    links_begin = node_get_children_start(cstate);

    for (child = ma->ptr_links[links_begin]; !link_is_terminating(child); child = ma->ptr_links[++links_begin])
    {
        stack_push(ptr_stack, link_get_label(child));

        where = link_get_link(child);

        enumerate_ints(ma, ptr_stack, ma->ptr_nodes[where], fetcher, user_data);

        stack_pop(ptr_stack);
    }
}